

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_bitwise.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateBaseType(ValidationState_t *_,Instruction *inst,uint32_t base_type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DiagnosticStream *pDVar4;
  spv_const_context psVar5;
  spv_const_validator_options psVar6;
  char *local_5e8;
  DiagnosticStream local_5e0;
  char *local_408;
  string local_400;
  DiagnosticStream local_3e0;
  char *local_208;
  DiagnosticStream local_200;
  Op local_28;
  uint32_t local_24;
  Op opcode;
  uint32_t base_type_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_24 = base_type;
  _opcode = inst;
  inst_local = (Instruction *)_;
  local_28 = Instruction::opcode(inst);
  bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_24);
  if ((bVar1) ||
     (bVar1 = ValidationState_t::IsIntVectorType((ValidationState_t *)inst_local,local_24), bVar1))
  {
    psVar5 = ValidationState_t::context((ValidationState_t *)inst_local);
    bVar1 = spvIsVulkanEnv(psVar5->target_env);
    if (((bVar1) &&
        (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_24),
        uVar2 != 0x20)) &&
       (psVar6 = ValidationState_t::options((ValidationState_t *)inst_local),
       (psVar6->allow_vulkan_32_bit_bitwise & 1U) == 0)) {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
      ValidationState_t::VkErrorID_abi_cxx11_
                (&local_400,(ValidationState_t *)inst_local,0x12ad,(char *)0x0);
      pDVar4 = DiagnosticStream::operator<<(&local_3e0,&local_400);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [44])"Expected 32-bit int type for Base operand: ");
      local_408 = spvOpcodeString(local_28);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_408);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      std::__cxx11::string::~string((string *)&local_400);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
    }
    else {
      uVar2 = local_24;
      uVar3 = Instruction::type_id(_opcode);
      if ((uVar2 == uVar3) || (local_28 == OpBitCount)) {
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  (&local_5e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_5e0,
                            (char (*) [48])"Expected Base Type to be equal to Result Type: ");
        local_5e8 = spvOpcodeString(local_28);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_5e8);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_5e0);
      }
    }
  }
  else {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
    pDVar4 = DiagnosticStream::operator<<
                       (&local_200,
                        (char (*) [54])"Expected int scalar or vector type for Base operand: ");
    local_208 = spvOpcodeString(local_28);
    pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_208);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateBaseType(ValidationState_t& _, const Instruction* inst,
                              const uint32_t base_type) {
  const spv::Op opcode = inst->opcode();

  if (!_.IsIntScalarType(base_type) && !_.IsIntVectorType(base_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected int scalar or vector type for Base operand: "
           << spvOpcodeString(opcode);
  }

  // Vulkan has a restriction to 32 bit for base
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (_.GetBitWidth(base_type) != 32 &&
        !_.options()->allow_vulkan_32_bit_bitwise) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4781)
             << "Expected 32-bit int type for Base operand: "
             << spvOpcodeString(opcode);
    }
  }

  // OpBitCount just needs same number of components
  if (base_type != inst->type_id() && opcode != spv::Op::OpBitCount) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Base Type to be equal to Result Type: "
           << spvOpcodeString(opcode);
  }

  return SPV_SUCCESS;
}